

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

Instr * __thiscall Func::GetFunctionEntryInsertionPoint(Func *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  if (this->topFunc != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7ea,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar2) goto LAB_0042a934;
    *puVar4 = 0;
  }
  pIVar5 = this->lastConstantAddressRegLoadInstr;
  if (pIVar5 == (Instr *)0x0) {
    pIVar5 = this->m_headInstr;
    BVar3 = HasTry(this);
    if (BVar3 != 0) {
      pIVar5 = pIVar5->m_next;
      if (((pIVar5->m_kind != InstrKindProfiledLabel) && (pIVar5->m_kind != InstrKindLabel)) ||
         (*(char *)&(pIVar5[1].m_src2)->_vptr_Opnd != '\x01')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7f7,
                           "(insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot)"
                           ,
                           "insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot"
                          );
        if (!bVar2) {
LAB_0042a934:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  return pIVar5->m_next;
}

Assistant:

IR::Instr *
Func::GetFunctionEntryInsertionPoint()
{
    Assert(this->GetTopFunc() == this);
    IR::Instr * insertInsert = this->lastConstantAddressRegLoadInstr;
    if (insertInsert != nullptr)
    {
        return insertInsert->m_next;
    }

    insertInsert = this->m_headInstr;

    if (this->HasTry())
    {
        // Insert it inside the root region
        insertInsert = insertInsert->m_next;
        Assert(insertInsert->IsLabelInstr() && insertInsert->AsLabelInstr()->GetRegion()->GetType() == RegionTypeRoot);
    }

    return insertInsert->m_next;
}